

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * LoadImageFromScreen(void)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  Image *in_RDI;
  Vector2 VVar4;
  float local_28;
  float fStack_24;
  
  VVar4 = GetWindowScaleDPI();
  iVar1 = GetScreenWidth();
  iVar2 = GetScreenHeight();
  local_28 = VVar4.x;
  fStack_24 = VVar4.y;
  in_RDI->width = (int)((float)iVar1 * local_28);
  in_RDI->height = (int)((float)iVar2 * fStack_24);
  in_RDI->mipmaps = 1;
  in_RDI->format = 7;
  puVar3 = rlReadScreenPixels((int)((float)iVar1 * local_28),(int)((float)iVar2 * fStack_24));
  in_RDI->data = puVar3;
  return in_RDI;
}

Assistant:

Image LoadImageFromScreen(void)
{
    Vector2 scale = GetWindowScaleDPI();
    Image image = { 0 };

    image.width = (int)(GetScreenWidth()*scale.x);
    image.height = (int)(GetScreenHeight()*scale.y);
    image.mipmaps = 1;
    image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
    image.data = rlReadScreenPixels(image.width, image.height);

    return image;
}